

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_key.c
# Opt level: O2

int check_cmf(FitsKey *pkey,FILE *out)

{
  size_t sVar1;
  int iVar2;
  
  if ((pkey->ktype & ~LOG_KEY) == CMI_KEY) {
    iVar2 = 1;
  }
  else {
    iVar2 = 0;
    sprintf(errmes,"Keyword #%d, %s: value = %s is not a floating point complex number.",
            (ulong)(uint)pkey->kindex,pkey,pkey->kvalue);
    if (pkey->ktype == STR_KEY) {
      sVar1 = strlen(errmes);
      builtin_strncpy(errmes + sVar1," The val",8);
      builtin_strncpy(errmes + sVar1 + 8,"ue is en",8);
      builtin_strncpy(errmes + sVar1 + 0x10,"tered as",8);
      builtin_strncpy(errmes + sVar1 + 0x18," a strin",8);
      builtin_strncpy(errmes + sVar1 + 0x20,"g. ",4);
    }
    wrterr(out,errmes,1);
  }
  return iVar2;
}

Assistant:

int check_cmf(FitsKey* pkey, FILE *out) 
{
    if(pkey->ktype != CMI_KEY && pkey->ktype != CMF_KEY) { 
        sprintf(errmes,
           "Keyword #%d, %s: value = %s is not a floating point complex number.",
        pkey->kindex,pkey->kname, pkey->kvalue);
	if(pkey->ktype == STR_KEY)  
	   strcat(errmes," The value is entered as a string. "); 
        wrterr(out,errmes,1); 
        return 0;
    } 
    return 1;
}